

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

int32_t __thiscall
icu_63::RuleBasedTimeZone::getLocalDelta
          (RuleBasedTimeZone *this,int32_t rawBefore,int32_t dstBefore,int32_t rawAfter,
          int32_t dstAfter,int32_t NonExistingTimeOpt,int32_t DuplicatedTimeOpt)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  UBool stdToDst;
  UBool dstToStd;
  int32_t offsetAfter;
  int32_t offsetBefore;
  int32_t delta;
  int32_t NonExistingTimeOpt_local;
  int32_t dstAfter_local;
  int32_t rawAfter_local;
  int32_t dstBefore_local;
  int32_t rawBefore_local;
  RuleBasedTimeZone *this_local;
  
  iVar1 = rawBefore + dstBefore;
  iVar2 = rawAfter + dstAfter;
  bVar3 = dstBefore == 0;
  bVar4 = dstAfter != 0;
  bVar5 = dstBefore != 0;
  bVar6 = dstAfter == 0;
  offsetAfter = iVar1;
  if (iVar2 - iVar1 < 0) {
    if (((((((DuplicatedTimeOpt & 3U) != 1) || (offsetAfter = iVar2, bVar3 || bVar4)) &&
          (((DuplicatedTimeOpt & 3U) != 3 || (offsetAfter = iVar2, bVar5 || bVar6)))) &&
         (((DuplicatedTimeOpt & 3U) != 1 || (offsetAfter = iVar1, bVar5 || bVar6)))) &&
        (((DuplicatedTimeOpt & 3U) != 3 || (offsetAfter = iVar1, bVar3 || bVar4)))) &&
       (offsetAfter = iVar2, (DuplicatedTimeOpt & 0xcU) == 4)) {
      offsetAfter = iVar1;
    }
  }
  else if ((((((NonExistingTimeOpt & 3U) != 1) || (bVar3 || bVar4)) &&
            (((NonExistingTimeOpt & 3U) != 3 || (bVar5 || bVar6)))) &&
           ((((NonExistingTimeOpt & 3U) != 1 || (offsetAfter = iVar2, bVar5 || bVar6)) &&
            (((NonExistingTimeOpt & 3U) != 3 || (offsetAfter = iVar2, bVar3 || bVar4)))))) &&
          (offsetAfter = iVar2, (NonExistingTimeOpt & 0xcU) == 0xc)) {
    offsetAfter = iVar1;
  }
  return offsetAfter;
}

Assistant:

int32_t
RuleBasedTimeZone::getLocalDelta(int32_t rawBefore, int32_t dstBefore, int32_t rawAfter, int32_t dstAfter,
                             int32_t NonExistingTimeOpt, int32_t DuplicatedTimeOpt) const {
    int32_t delta = 0;

    int32_t offsetBefore = rawBefore + dstBefore;
    int32_t offsetAfter = rawAfter + dstAfter;

    UBool dstToStd = (dstBefore != 0) && (dstAfter == 0);
    UBool stdToDst = (dstBefore == 0) && (dstAfter != 0);

    if (offsetAfter - offsetBefore >= 0) {
        // Positive transition, which makes a non-existing local time range
        if (((NonExistingTimeOpt & kStdDstMask) == kStandard && dstToStd)
                || ((NonExistingTimeOpt & kStdDstMask) == kDaylight && stdToDst)) {
            delta = offsetBefore;
        } else if (((NonExistingTimeOpt & kStdDstMask) == kStandard && stdToDst)
                || ((NonExistingTimeOpt & kStdDstMask) == kDaylight && dstToStd)) {
            delta = offsetAfter;
        } else if ((NonExistingTimeOpt & kFormerLatterMask) == kLatter) {
            delta = offsetBefore;
        } else {
            // Interprets the time with rule before the transition,
            // default for non-existing time range
            delta = offsetAfter;
        }
    } else {
        // Negative transition, which makes a duplicated local time range
        if (((DuplicatedTimeOpt & kStdDstMask) == kStandard && dstToStd)
                || ((DuplicatedTimeOpt & kStdDstMask) == kDaylight && stdToDst)) {
            delta = offsetAfter;
        } else if (((DuplicatedTimeOpt & kStdDstMask) == kStandard && stdToDst)
                || ((DuplicatedTimeOpt & kStdDstMask) == kDaylight && dstToStd)) {
            delta = offsetBefore;
        } else if ((DuplicatedTimeOpt & kFormerLatterMask) == kFormer) {
            delta = offsetBefore;
        } else {
            // Interprets the time with rule after the transition,
            // default for duplicated local time range
            delta = offsetAfter;
        }
    }
    return delta;
}